

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta.cc
# Opt level: O3

void __thiscall
tchecker::ta::ta_t::ta_t
          (ta_t *this,shared_ptr<const_tchecker::ta::system_t> *system,sharing_type_t sharing_type,
          size_t block_size,size_t table_size)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  size_t intval_capacity;
  element_type *peVar2;
  
  (this->
  super_fwd_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>
  )._vptr_fwd_t = (_func_int **)&PTR__ta_t_0027f588;
  (this->
  super_bwd_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>
  )._vptr_bwd_t = (_func_int **)&PTR__ta_t_0027f648;
  (this->
  super_fwd_impl_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::syncprod::outgoing_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t>,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t>
  )._vptr_fwd_impl_t = (_func_int **)&PTR__ta_t_0027f678;
  (this->super_bwd_impl_t<_4ab49c33_>)._vptr_bwd_impl_t = (_func_int **)&PTR__ta_t_0027f6b8;
  (this->
  super_builder_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>
  )._vptr_builder_t = (_func_int **)&PTR__ta_t_0027f6f8;
  (this->
  super_inspector_t<tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>
  )._vptr_inspector_t = (_func_int **)&PTR__ta_t_0027f720;
  (this->
  super_sharing_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>
  )._vptr_sharing_t = (_func_int **)&PTR__ta_t_0027f768;
  peVar2 = (system->super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  (this->_system).super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar2;
  p_Var1 = (system->super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->_system).super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
      peVar2 = (this->_system).
               super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->_sharing_type = sharing_type;
  intval_capacity =
       *(stored_size_type *)
        ((long)&(peVar2->super_system_t).super_system_t.super_intvars_t._integer_variables.
                super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        + 0x58);
  if (intval_capacity ==
      *(stored_size_type *)
       ((long)&(peVar2->super_system_t).super_system_t.super_intvars_t._integer_variables.
               super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       + 0x70)) {
    details::
    state_pool_allocator_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>::
    state_pool_allocator_t
              (&(this->_state_allocator).
                super_state_pool_allocator_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>
               ,block_size,block_size,
               ((long)*(pointer *)
                       ((long)&(peVar2->super_system_t).super_system_t.super_processes_t.
                               _procs_attributes.
                               super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                       + 8) -
                (long)(peVar2->super_system_t).super_system_t.super_processes_t._procs_attributes.
                      super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,
               block_size,intval_capacity,table_size);
    peVar2 = (this->_system).
             super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    syncprod::details::
    transition_pool_allocator_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>
    ::transition_pool_allocator_t
              ((transition_pool_allocator_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>
                *)&this->_transition_allocator,block_size,block_size,
               ((long)*(pointer *)
                       ((long)&(peVar2->super_system_t).super_system_t.super_processes_t.
                               _procs_attributes.
                               super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                       + 8) -
                (long)(peVar2->super_system_t).super_system_t.super_processes_t._procs_attributes.
                      super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,
               table_size);
    return;
  }
  __assert_fail("_key_map.size() == _value_map.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/index.hh"
                ,0x90,
                "size_t tchecker::index_t<unsigned int, std::basic_string<char>>::size() const [KEY = unsigned int, T = std::basic_string<char>]"
               );
}

Assistant:

ta_t::ta_t(std::shared_ptr<tchecker::ta::system_t const> const & system, enum tchecker::ts::sharing_type_t sharing_type,
           std::size_t block_size, std::size_t table_size)
    : _system(system), _sharing_type(sharing_type),
      _state_allocator(block_size, block_size, _system->processes_count(), block_size,
                       _system->intvars_count(tchecker::VK_FLATTENED), table_size),
      _transition_allocator(block_size, block_size, _system->processes_count(), table_size)
{
}